

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-tests.c
# Opt level: O0

int maybe_run_test(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  __uid_t _Var4;
  __gid_t _Var5;
  int *piVar6;
  ssize_t sVar7;
  bool bVar8;
  uint local_2f0;
  int64_t eval_b_13;
  size_t __cpu;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  cpu_set_t cpuset;
  int cpumask_size;
  int cpu;
  int r_3;
  int i;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  uv_gid_t gid;
  uv_uid_t uid;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  uv_os_fd_t open_fd;
  uv_os_fd_t closed_fd;
  int64_t eval_b_4;
  int64_t eval_a_4;
  void *eval_b_3;
  void *eval_a_3;
  char *test;
  undefined8 uStack_178;
  int r_2;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  ssize_t sStack_150;
  int r_1;
  ssize_t r;
  char cStack_140;
  char out [15];
  void *eval_b;
  void *eval_a;
  char buffer [256];
  char **argv_local;
  int argc_local;
  
  iVar1 = strcmp(argv[1],"--list");
  if (iVar1 == 0) {
    print_tests((FILE *)_stdout);
    argv_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(argv[1],"ipc_helper_listen_before_write");
    if (iVar1 == 0) {
      argv_local._4_4_ = ipc_helper(0);
    }
    else {
      iVar1 = strcmp(argv[1],"ipc_helper_listen_after_write");
      if (iVar1 == 0) {
        argv_local._4_4_ = ipc_helper(1);
      }
      else {
        iVar1 = strcmp(argv[1],"ipc_helper_heavy_traffic_deadlock_bug");
        if (iVar1 == 0) {
          argv_local._4_4_ = ipc_helper_heavy_traffic_deadlock_bug();
        }
        else {
          iVar1 = strcmp(argv[1],"ipc_send_recv_helper");
          if (iVar1 == 0) {
            argv_local._4_4_ = ipc_send_recv_helper();
          }
          else {
            iVar1 = strcmp(argv[1],"ipc_helper_tcp_connection");
            if (iVar1 == 0) {
              argv_local._4_4_ = ipc_helper_tcp_connection();
            }
            else {
              iVar1 = strcmp(argv[1],"ipc_helper_bind_twice");
              if (iVar1 == 0) {
                argv_local._4_4_ = ipc_helper_bind_twice();
              }
              else {
                iVar1 = strcmp(argv[1],"ipc_helper_send_zero");
                if (iVar1 == 0) {
                  argv_local._4_4_ = ipc_helper_send_zero();
                }
                else {
                  iVar1 = strcmp(argv[1],"stdio_over_pipes_helper");
                  if (iVar1 == 0) {
                    argv_local._4_4_ = stdio_over_pipes_helper();
                  }
                  else {
                    iVar1 = strcmp(argv[1],"spawn_helper1");
                    if (iVar1 == 0) {
                      notify_parent_process();
                      argv_local._4_4_ = 1;
                    }
                    else {
                      iVar1 = strcmp(argv[1],"spawn_helper2");
                      if (iVar1 == 0) {
                        notify_parent_process();
                        printf("hello world\n");
                        argv_local._4_4_ = 1;
                      }
                      else {
                        iVar1 = strcmp(argv[1],"spawn_tcp_server_helper");
                        if (iVar1 == 0) {
                          notify_parent_process();
                          argv_local._4_4_ = spawn_tcp_server_helper();
                        }
                        else {
                          iVar1 = strcmp(argv[1],"spawn_helper3");
                          if (iVar1 == 0) {
                            notify_parent_process();
                            out._7_8_ = fgets((char *)&eval_a,0xff,_stdin);
                            if (&eval_a != (void **)out._7_8_) {
                              fprintf(_stderr,
                                      "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                      ,0x9c,"buffer","==","fgets(buffer, sizeof(buffer) - 1, stdin)"
                                      ,&eval_a,"==",out._7_8_);
                              abort();
                            }
                            buffer[0xf7] = '\0';
                            fputs((char *)&eval_a,_stdout);
                            argv_local._4_4_ = 1;
                          }
                          else {
                            iVar1 = strcmp(argv[1],"spawn_helper4");
                            if (iVar1 == 0) {
                              notify_parent_process();
                              do {
                                uv_sleep(10000);
                              } while( true );
                            }
                            iVar1 = strcmp(argv[1],"spawn_helper5");
                            if (iVar1 == 0) {
                              r._1_1_ = 'f';
                              r._2_1_ = 'o';
                              r._3_1_ = 'u';
                              r._4_1_ = 'r';
                              r._5_1_ = 't';
                              r._6_1_ = 'h';
                              r._7_1_ = ' ';
                              cStack_140 = 's';
                              builtin_strncpy(out,"tdio!\n",7);
                              notify_parent_process();
                              do {
                                sStack_150 = write(3,(void *)((long)&r + 1),0xe);
                                bVar8 = false;
                                if (sStack_150 == -1) {
                                  piVar6 = __errno_location();
                                  bVar8 = *piVar6 == 4;
                                }
                              } while (bVar8);
                              fsync(3);
                              argv_local._4_4_ = 1;
                            }
                            else {
                              iVar1 = strcmp(argv[1],"spawn_helper6");
                              if (iVar1 == 0) {
                                notify_parent_process();
                                eval_a_1._4_4_ = fprintf(_stdout,"hello world\n");
                                eval_b_1 = (int64_t)eval_a_1._4_4_;
                                eval_a_2 = 0;
                                if (eval_b_1 < 1) {
                                  fprintf(_stderr,
                                          "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                          ,0xc2,"r",">","0",eval_b_1,">",0);
                                  abort();
                                }
                                eval_a_1._4_4_ = fprintf(_stderr,"hello errworld\n");
                                eval_b_2 = (int64_t)eval_a_1._4_4_;
                                uStack_178 = 0;
                                if (eval_b_2 < 1) {
                                  fprintf(_stderr,
                                          "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                          ,0xc5,"r",">","0",eval_b_2,">",0);
                                  abort();
                                }
                                argv_local._4_4_ = 1;
                              }
                              else {
                                iVar1 = strcmp(argv[1],"spawn_helper7");
                                if (iVar1 == 0) {
                                  notify_parent_process();
                                  eval_b_3 = getenv("ENV_TEST");
                                  eval_a_4 = 0;
                                  eval_a_3 = eval_b_3;
                                  if ((char *)eval_b_3 == (char *)0x0) {
                                    fprintf(_stderr,
                                            "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                            ,0xd2,"test","!=","NULL",0,"!=",0);
                                    abort();
                                  }
                                  test._4_4_ = fprintf(_stdout,"%s",eval_b_3);
                                  eval_b_4 = (int64_t)test._4_4_;
                                  _open_fd = 0;
                                  if (eval_b_4 < 1) {
                                    fprintf(_stderr,
                                            "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                            ,0xd5,"r",">","0",eval_b_4,">",0);
                                    abort();
                                  }
                                  argv_local._4_4_ = 1;
                                }
                                else {
                                  iVar1 = strcmp(argv[1],"spawn_helper8");
                                  if (iVar1 == 0) {
                                    notify_parent_process();
                                    sVar7 = read(0,(void *)((long)&eval_a_5 + 4),4);
                                    if (sVar7 != 4) {
                                      fprintf(_stderr,
                                              "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                              ,0xe3,"sizeof(closed_fd)","==",
                                              "read(0, &closed_fd, sizeof(closed_fd))",4,"==",sVar7)
                                      ;
                                      abort();
                                    }
                                    sVar7 = read(0,&eval_a_5,4);
                                    if (sVar7 != 4) {
                                      fprintf(_stderr,
                                              "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                              ,0xe4,"sizeof(open_fd)","==",
                                              "read(0, &open_fd, sizeof(open_fd))",4,"==",sVar7);
                                      abort();
                                    }
                                    if ((long)(int)eval_a_5 < 3) {
                                      fprintf(_stderr,
                                              "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                              ,0xef,"open_fd",">","2",(long)(int)eval_a_5,">",2);
                                      abort();
                                    }
                                    if ((long)eval_a_5._4_4_ < 3) {
                                      fprintf(_stderr,
                                              "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                              ,0xf0,"closed_fd",">","2",(long)eval_a_5._4_4_,">",2);
                                      abort();
                                    }
                                    sVar7 = write(eval_a_5._4_4_,"x",1);
                                    if (sVar7 != -1) {
                                      fprintf(_stderr,
                                              "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                              ,0xf4,"-1","==","write(closed_fd, \"x\", 1)",
                                              0xffffffffffffffff,"==",sVar7);
                                      abort();
                                    }
                                    argv_local._4_4_ = 1;
                                  }
                                  else {
                                    iVar1 = strcmp(argv[1],"spawn_helper9");
                                    if (iVar1 == 0) {
                                      notify_parent_process();
                                      spawn_stdin_stdout();
                                      argv_local._4_4_ = 1;
                                    }
                                    else {
                                      iVar1 = strcmp(argv[1],"spawn_helper_setuid_setgid");
                                      if (iVar1 == 0) {
                                        uVar2 = atoi(argv[2]);
                                        uVar3 = atoi(argv[3]);
                                        _Var4 = getuid();
                                        if ((ulong)uVar2 != (ulong)_Var4) {
                                          fprintf(_stderr,
                                                  "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                                  ,0x105,"uid","==","getuid()",(ulong)uVar2,"==",
                                                  (ulong)_Var4);
                                          abort();
                                        }
                                        _Var5 = getgid();
                                        if ((ulong)uVar3 != (ulong)_Var5) {
                                          fprintf(_stderr,
                                                  "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                                  ,0x106,"gid","==","getgid()",(ulong)uVar3,"==",
                                                  (ulong)_Var5);
                                          abort();
                                        }
                                        notify_parent_process();
                                        argv_local._4_4_ = 1;
                                      }
                                      else {
                                        iVar1 = strcmp(argv[1],"spawn_helper_affinity");
                                        if (iVar1 == 0) {
                                          cpuset.__bits[0xf]._0_4_ = uv_cpumask_size();
                                          if ((int)cpuset.__bits[0xf] < 1) {
                                            fprintf(_stderr,
                                                  "Assertion failed in %s on line %d: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                                  ,0x11d,"cpumask_size > 0");
                                            abort();
                                          }
                                          cpuset.__bits[0xf]._4_4_ = atoi(argv[2]);
                                          if (cpuset.__bits[0xf]._4_4_ < 0) {
                                            fprintf(_stderr,
                                                  "Assertion failed in %s on line %d: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                                  ,0x120,"cpu >= 0");
                                            abort();
                                          }
                                          if ((int)cpuset.__bits[0xf] <= cpuset.__bits[0xf]._4_4_) {
                                            fprintf(_stderr,
                                                  "Assertion failed in %s on line %d: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                                  ,0x121,"cpu < cpumask_size");
                                            abort();
                                          }
                                          memset(&eval_a_12,0,0x80);
                                          iVar1 = sched_getaffinity(0,0x80,(cpu_set_t *)&eval_a_12);
                                          if (iVar1 == 0) {
                                            cpumask_size = 0;
                                          }
                                          else {
                                            piVar6 = __errno_location();
                                            cpumask_size = *piVar6;
                                          }
                                          if ((long)cpumask_size != 0) {
                                            fprintf(_stderr,
                                                  "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                                  ,0x135,"r","==","0",(long)cpumask_size,"==",0);
                                            abort();
                                          }
                                          for (cpu = 0; cpu < (int)cpuset.__bits[0xf]; cpu = cpu + 1
                                              ) {
                                            if ((ulong)(long)cpu >> 3 < 0x80) {
                                              local_2f0 = (uint)((cpuset.__bits
                                                                  [((ulong)(long)cpu >> 6) - 1] &
                                                                 1L << ((byte)cpu & 0x3f)) != 0);
                                            }
                                            else {
                                              local_2f0 = 0;
                                            }
                                            if ((long)(int)local_2f0 !=
                                                (long)(int)(uint)(cpu == cpuset.__bits[0xf]._4_4_))
                                            {
                                              fprintf(_stderr,
                                                  "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                                                  ,0x137,
                                                  "(__extension__ ({ size_t __cpu = (i); __cpu / 8 < (sizeof (cpu_set_t)) ? ((((const __cpu_mask *) ((&cpuset)->__bits))[((__cpu) / (8 * sizeof (__cpu_mask)))] & ((__cpu_mask) 1 << ((__cpu) % (8 * sizeof (__cpu_mask)))))) != 0 : 0; }))"
                                                  ,"==","(i == cpu)",(long)(int)local_2f0,"==",
                                                  (long)(int)(uint)(cpu == cpuset.__bits[0xf]._4_4_)
                                                  );
                                              abort();
                                            }
                                          }
                                          argv_local._4_4_ = 1;
                                        }
                                        else {
                                          iVar1 = strcmp(argv[1],"process_title_big_argv_helper");
                                          if (iVar1 == 0) {
                                            notify_parent_process();
                                            process_title_big_argv();
                                            argv_local._4_4_ = 0;
                                          }
                                          else {
                                            argv_local._4_4_ = run_test(argv[1],0,1);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

static int maybe_run_test(int argc, char **argv) {
  if (strcmp(argv[1], "--list") == 0) {
    print_tests(stdout);
    return 0;
  }

  if (strcmp(argv[1], "ipc_helper_listen_before_write") == 0) {
    return ipc_helper(0);
  }

  if (strcmp(argv[1], "ipc_helper_listen_after_write") == 0) {
    return ipc_helper(1);
  }

  if (strcmp(argv[1], "ipc_helper_heavy_traffic_deadlock_bug") == 0) {
    return ipc_helper_heavy_traffic_deadlock_bug();
  }

  if (strcmp(argv[1], "ipc_send_recv_helper") == 0) {
    return ipc_send_recv_helper();
  }

  if (strcmp(argv[1], "ipc_helper_tcp_connection") == 0) {
    return ipc_helper_tcp_connection();
  }

  if (strcmp(argv[1], "ipc_helper_bind_twice") == 0) {
    return ipc_helper_bind_twice();
  }

  if (strcmp(argv[1], "ipc_helper_send_zero") == 0) {
    return ipc_helper_send_zero();
  }

  if (strcmp(argv[1], "stdio_over_pipes_helper") == 0) {
    return stdio_over_pipes_helper();
  }

  if (strcmp(argv[1], "spawn_helper1") == 0) {
    notify_parent_process();
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper2") == 0) {
    notify_parent_process();
    printf("hello world\n");
    return 1;
  }

  if (strcmp(argv[1], "spawn_tcp_server_helper") == 0) {
    notify_parent_process();
    return spawn_tcp_server_helper();
  }

  if (strcmp(argv[1], "spawn_helper3") == 0) {
    char buffer[256];
    notify_parent_process();
    ASSERT_PTR_EQ(buffer, fgets(buffer, sizeof(buffer) - 1, stdin));
    buffer[sizeof(buffer) - 1] = '\0';
    fputs(buffer, stdout);
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper4") == 0) {
    notify_parent_process();
    /* Never surrender, never return! */
    for (;;) uv_sleep(10000);
  }

  if (strcmp(argv[1], "spawn_helper5") == 0) {
    const char out[] = "fourth stdio!\n";
    notify_parent_process();
    {
#ifdef _WIN32
      DWORD bytes;
      WriteFile((HANDLE) _get_osfhandle(3), out, sizeof(out) - 1, &bytes, NULL);
#else
      ssize_t r;

      do
        r = write(3, out, sizeof(out) - 1);
      while (r == -1 && errno == EINTR);

      fsync(3);
#endif
    }
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper6") == 0) {
    int r;

    notify_parent_process();

    r = fprintf(stdout, "hello world\n");
    ASSERT_GT(r, 0);

    r = fprintf(stderr, "hello errworld\n");
    ASSERT_GT(r, 0);

    return 1;
  }

  if (strcmp(argv[1], "spawn_helper7") == 0) {
    int r;
    char *test;

    notify_parent_process();

    /* Test if the test value from the parent is still set */
    test = getenv("ENV_TEST");
    ASSERT_NOT_NULL(test);

    r = fprintf(stdout, "%s", test);
    ASSERT_GT(r, 0);

    return 1;
  }

  if (strcmp(argv[1], "spawn_helper8") == 0) {
    uv_os_fd_t closed_fd;
    uv_os_fd_t open_fd;
#ifdef _WIN32
    DWORD flags;
    HMODULE kernelbase_module;
    sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#endif
    notify_parent_process();
    ASSERT_EQ(sizeof(closed_fd), read(0, &closed_fd, sizeof(closed_fd)));
    ASSERT_EQ(sizeof(open_fd), read(0, &open_fd, sizeof(open_fd)));
#ifdef _WIN32
    ASSERT_GT((intptr_t) closed_fd, 0);
    ASSERT_GT((intptr_t) open_fd, 0);
    ASSERT_NE(0, GetHandleInformation(open_fd, &flags));
    kernelbase_module = GetModuleHandleA("kernelbase.dll");
    pCompareObjectHandles = (sCompareObjectHandles)
        GetProcAddress(kernelbase_module, "CompareObjectHandles");
    ASSERT_NE(pCompareObjectHandles == NULL || \
              !pCompareObjectHandles(open_fd, closed_fd), 0);
#else
    ASSERT_GT(open_fd, 2);
    ASSERT_GT(closed_fd, 2);
# if defined(__PASE__)  /* On IBMi PASE, write() returns 1 */
    ASSERT_EQ(1, write(closed_fd, "x", 1));
# else
    ASSERT_EQ(-1, write(closed_fd, "x", 1));
# endif  /* !__PASE__ */
#endif
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper9") == 0) {
    notify_parent_process();
    spawn_stdin_stdout();
    return 1;
  }

#ifndef _WIN32
  if (strcmp(argv[1], "spawn_helper_setuid_setgid") == 0) {
    uv_uid_t uid = atoi(argv[2]);
    uv_gid_t gid = atoi(argv[3]);

    ASSERT_EQ(uid, getuid());
    ASSERT_EQ(gid, getgid());
    notify_parent_process();

    return 1;
  }
#endif  /* !_WIN32 */

#if !defined(NO_CPU_AFFINITY)
  if (strcmp(argv[1], "spawn_helper_affinity") == 0) {
    int i;
    int r;
    int cpu;
    int cpumask_size;
#ifdef _WIN32
    DWORD_PTR procmask;
    DWORD_PTR sysmask;
#elif defined(__linux__)
    cpu_set_t cpuset;
#else
    cpuset_t cpuset;
#endif

    cpumask_size = uv_cpumask_size();
    ASSERT(cpumask_size > 0);

    cpu = atoi(argv[2]);
    ASSERT(cpu >= 0);
    ASSERT(cpu < cpumask_size);

    /* verify the mask has the cpu we expect */
#ifdef _WIN32
    r = GetProcessAffinityMask(GetCurrentProcess(), &procmask, &sysmask);
    ASSERT(r != 0);
    for (i = 0; i < cpumask_size; ++i) {
      ASSERT(((procmask & (((DWORD_PTR)1) << i)) != 0) == (i == cpu));
    }
#else
    CPU_ZERO(&cpuset);
#ifdef __linux__
    r = sched_getaffinity(0, sizeof(cpuset), &cpuset);
    if (r)
      r = errno;
    else
      r = 0;
#else
    r = pthread_getaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
#endif
    ASSERT_EQ(r, 0);
    for (i = 0; i < cpumask_size; ++i) {
      ASSERT_EQ(CPU_ISSET(i, &cpuset), (i == cpu));
    }
#endif

    return 1;
  }
#endif

  if (strcmp(argv[1], "process_title_big_argv_helper") == 0) {
    notify_parent_process();
    process_title_big_argv();
    return 0;
  }

  return run_test(argv[1], 0, 1);
}